

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_39dd::test_iterator_read(void **param_1)

{
  roaring64_bitmap_t *r;
  roaring64_iterator_t *prVar1;
  uint64_t uVar2;
  allocator_type local_79;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  uint64_t v;
  value_type local_40;
  roaring64_bulk_context_t context;
  
  r = roaring64_bitmap_create();
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&values,1000);
  context.high_bytes[0] = '\0';
  context.high_bytes[1] = '\0';
  context.high_bytes[2] = '\0';
  context.high_bytes[3] = '\0';
  context.high_bytes[4] = '\0';
  context.high_bytes[5] = '\0';
  context._6_2_ = 0;
  context.leaf = (roaring64_leaf_t *)0x0;
  for (uVar2 = 0; uVar2 != 10000000; uVar2 = uVar2 + 10000) {
    v = uVar2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&values,&v);
    roaring64_bitmap_add_bulk(r,(roaring64_bulk_context_t *)&context,v);
  }
  prVar1 = roaring64_iterator_create(r);
  uVar2 = roaring64_iterator_read(prVar1,&v,0);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x6d3);
  roaring64_iterator_free(prVar1);
  readCompare(&values,(roaring64_bitmap_t *)r,1);
  readCompare(&values,(roaring64_bitmap_t *)r,2);
  readCompare(&values,(roaring64_bitmap_t *)r,
              ((long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  readCompare(&values,(roaring64_bitmap_t *)r,
              (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start >> 3);
  readCompare(&values,(roaring64_bitmap_t *)r,
              ((long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  prVar1 = roaring64_iterator_create(r);
  local_40 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&v,
             (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_40,&local_79);
  uVar2 = roaring64_iterator_read(prVar1,(uint64_t *)v,0xffffffffffffffff);
  _assert_int_equal(uVar2,1000,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x6e2);
  assert_vector_equal((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&v,&values);
  roaring64_iterator_free(prVar1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&v);
  prVar1 = roaring64_iterator_create(r);
  local_40 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&v,
             (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_40,&local_79);
  uVar2 = roaring64_iterator_read(prVar1,(uint64_t *)v,0xffffffff00000000);
  _assert_int_equal(uVar2,1000,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x6eb);
  assert_vector_equal((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&v,&values);
  roaring64_iterator_free(prVar1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&v);
  roaring64_bitmap_free(r);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_read) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    std::vector<uint64_t> values;
    values.reserve(1000);
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 1000; ++i) {
        uint64_t v = i * 10000;
        values.push_back(v);
        roaring64_bitmap_add_bulk(r, &context, v);
    }

    {
        // Check that a zero count results in zero elements read.
        roaring64_iterator_t* it = roaring64_iterator_create(r);
        uint64_t buf[1];
        assert_int_equal(roaring64_iterator_read(it, buf, 0), 0);
        roaring64_iterator_free(it);
    }

    readCompare(values, r, 1);
    readCompare(values, r, 2);
    readCompare(values, r, values.size() - 1);
    readCompare(values, r, values.size());
    readCompare(values, r, values.size() + 1);

    {
        // A count of UINT64_MAX.
        roaring64_iterator_t* it = roaring64_iterator_create(r);
        std::vector<uint64_t> buf(values.size(), 0);
        assert_int_equal(roaring64_iterator_read(it, buf.data(), UINT64_MAX),
                         1000);
        assert_vector_equal(buf, values);
        roaring64_iterator_free(it);
    }
    {
        // A count that becomes zero if cast to uint32.
        roaring64_iterator_t* it = roaring64_iterator_create(r);
        std::vector<uint64_t> buf(values.size(), 0);
        assert_int_equal(
            roaring64_iterator_read(it, buf.data(), 0xFFFFFFFF00000000), 1000);
        assert_vector_equal(buf, values);
        roaring64_iterator_free(it);
    }

    roaring64_bitmap_free(r);
}